

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesCommand.cxx
# Opt level: O3

void __thiscall cmInstallFilesCommand::FinalPass(cmInstallFilesCommand *this)

{
  pointer pcVar1;
  pointer pbVar2;
  size_type sVar3;
  long *plVar4;
  undefined8 *puVar5;
  char *pcVar6;
  ulong *puVar7;
  size_type *psVar8;
  pointer pbVar9;
  _Alloc_hider _Var10;
  undefined8 uVar11;
  ulong uVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string temps;
  string ext;
  string testf;
  string local_148;
  string local_128;
  cmInstallFilesCommand *local_100;
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  long lStack_e0;
  string local_d8;
  string local_b8;
  long *local_98 [2];
  long local_88 [2];
  char *local_78;
  undefined8 local_70;
  char local_68;
  undefined7 uStack_67;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  string local_50;
  
  if (this->IsFilesForm == false) {
    local_78 = &local_68;
    local_70 = 0;
    local_68 = '\0';
    pbVar9 = (this->FinalArgs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_98[0] = local_88;
    pcVar1 = (pbVar9->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,pcVar1,pcVar1 + pbVar9->_M_string_length);
    pbVar9 = (this->FinalArgs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->FinalArgs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_100 = this;
    if ((ulong)((long)pbVar2 - (long)pbVar9) < 0x21) {
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      pcVar1 = (pbVar9->_M_dataplus)._M_p;
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,pcVar1,pcVar1 + pbVar9->_M_string_length);
      pcVar6 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::string((string *)&local_148,pcVar6,(allocator *)&local_f8);
      cmSystemTools::Glob(&local_148,&local_d8,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if (local_128._M_dataplus._M_p != (pointer)local_128._M_string_length) {
        _Var10._M_p = local_128._M_dataplus._M_p;
        do {
          FindInstallSource_abi_cxx11_(&local_148,this,*(char **)_Var10._M_p);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->Files,&local_148);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          _Var10._M_p = _Var10._M_p + 0x20;
        } while (_Var10._M_p != (pointer)local_128._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_128);
    }
    else {
      pbVar9 = pbVar9 + 1;
      if (pbVar9 != pbVar2) {
        local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Files
        ;
        do {
          pcVar1 = (pbVar9->_M_dataplus)._M_p;
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,pcVar1,pcVar1 + pbVar9->_M_string_length);
          cmsys::SystemTools::GetFilenamePath(&local_148,&local_d8);
          sVar3 = local_148._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          if (sVar3 == 0) {
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_128,&local_d8);
            plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_98[0]);
            psVar8 = (size_type *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_148.field_2._M_allocated_capacity = *psVar8;
              local_148.field_2._8_8_ = plVar4[3];
              local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            }
            else {
              local_148.field_2._M_allocated_capacity = *psVar8;
              local_148._M_dataplus._M_p = (pointer)*plVar4;
            }
            local_148._M_string_length = plVar4[1];
            *plVar4 = (long)psVar8;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_78,(string *)&local_148);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            uVar11 = local_128.field_2._M_allocated_capacity;
            _Var10._M_p = local_128._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) goto LAB_0026dfb1;
          }
          else {
            cmsys::SystemTools::GetFilenamePath(&local_50,&local_d8);
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
            local_f8 = &local_e8;
            puVar7 = (ulong *)(plVar4 + 2);
            if ((ulong *)*plVar4 == puVar7) {
              local_e8 = *puVar7;
              lStack_e0 = plVar4[3];
            }
            else {
              local_e8 = *puVar7;
              local_f8 = (ulong *)*plVar4;
            }
            local_f0 = plVar4[1];
            *plVar4 = (long)puVar7;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_b8,&local_d8);
            uVar12 = 0xf;
            if (local_f8 != &local_e8) {
              uVar12 = local_e8;
            }
            if (uVar12 < local_b8._M_string_length + local_f0) {
              uVar11 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                uVar11 = local_b8.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar11 < local_b8._M_string_length + local_f0) goto LAB_0026ddf0;
              puVar5 = (undefined8 *)
                       std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_f8)
              ;
            }
            else {
LAB_0026ddf0:
              puVar5 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_f8,(ulong)local_b8._M_dataplus._M_p);
            }
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            psVar8 = puVar5 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_128.field_2._M_allocated_capacity = *psVar8;
              local_128.field_2._8_8_ = puVar5[3];
            }
            else {
              local_128.field_2._M_allocated_capacity = *psVar8;
              local_128._M_dataplus._M_p = (pointer)*puVar5;
            }
            local_128._M_string_length = puVar5[1];
            *puVar5 = psVar8;
            puVar5[1] = 0;
            *(undefined1 *)psVar8 = 0;
            plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_98[0]);
            psVar8 = (size_type *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_148.field_2._M_allocated_capacity = *psVar8;
              local_148.field_2._8_8_ = plVar4[3];
              local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            }
            else {
              local_148.field_2._M_allocated_capacity = *psVar8;
              local_148._M_dataplus._M_p = (pointer)*plVar4;
            }
            local_148._M_string_length = plVar4[1];
            *plVar4 = (long)psVar8;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_78,(string *)&local_148);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            if (local_f8 != &local_e8) {
              operator_delete(local_f8,local_e8 + 1);
            }
            uVar11 = local_50.field_2._M_allocated_capacity;
            _Var10._M_p = local_50._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_0026dfb1:
              operator_delete(_Var10._M_p,uVar11 + 1);
            }
          }
          FindInstallSource_abi_cxx11_(&local_148,local_100,local_78);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_58,&local_148);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          pbVar9 = pbVar9 + 1;
        } while (pbVar9 != (local_100->FinalArgs).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    CreateInstallGenerator(local_100);
    if (local_98[0] != local_88) {
      operator_delete(local_98[0],local_88[0] + 1);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
    }
  }
  return;
}

Assistant:

void cmInstallFilesCommand::FinalPass()
{
  // No final pass for "FILES" form of arguments.
  if(this->IsFilesForm)
    {
    return;
    }

  std::string testf;
  std::string ext = this->FinalArgs[0];

  // two different options
  if (this->FinalArgs.size() > 1)
    {
    // now put the files into the list
    std::vector<std::string>::iterator s = this->FinalArgs.begin();
    ++s;
    // for each argument, get the files
    for (;s != this->FinalArgs.end(); ++s)
      {
      // replace any variables
      std::string temps = *s;
      if (!cmSystemTools::GetFilenamePath(temps).empty())
        {
          testf = cmSystemTools::GetFilenamePath(temps) + "/" +
            cmSystemTools::GetFilenameWithoutLastExtension(temps) + ext;
        }
      else
        {
          testf = cmSystemTools::GetFilenameWithoutLastExtension(temps) + ext;
        }

      // add to the result
      this->Files.push_back(this->FindInstallSource(testf.c_str()));
      }
    }
  else     // reg exp list
    {
    std::vector<std::string> files;
    std::string regex = this->FinalArgs[0];
    cmSystemTools::Glob(this->Makefile->GetCurrentSourceDirectory(),
                        regex, files);

    std::vector<std::string>::iterator s = files.begin();
    // for each argument, get the files
    for (;s != files.end(); ++s)
      {
      this->Files.push_back(this->FindInstallSource(s->c_str()));
      }
    }

  this->CreateInstallGenerator();
}